

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::Graph::performLocalNameSearch(Graph *this,NameSearch *search,Statement *s)

{
  pool_ptr<soul::AST::ProcessorInstance> i;
  ASTObject *local_20;
  
  ModuleBase::performLocalNameSearch((ModuleBase *)this,search,s);
  if (search->findProcessorInstances == true) {
    if ((search->partiallyQualifiedPath).pathSections.numActive == 0) {
      throwInternalCompilerError("! empty()","back",0xaa);
    }
    findChildProcessor<soul::Identifier>((Graph *)&stack0xffffffffffffffe0,(Identifier *)this);
    if (local_20 != (ASTObject *)0x0) {
      Scope::NameSearch::addResult(search,local_20);
    }
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* s) const override
        {
            ProcessorBase::performLocalNameSearch (search, s);

            if (search.findProcessorInstances)
                if (auto i = findChildProcessor (search.partiallyQualifiedPath.getLastPart()))
                    search.addResult (*i);
        }